

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O2

unsafe_unique_array<char> __thiscall
duckdb::ArrowSchemaMetadata::SerializeMetadata(ArrowSchemaMetadata *this)

{
  void *__dest;
  __buckets_ptr pp_Var1;
  size_t __n;
  size_t __n_00;
  long *plVar2;
  long in_RSI;
  size_t n;
  long *plVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  
  plVar3 = (long *)(in_RSI + 0x10);
  n = 4;
  plVar2 = plVar3;
  while (plVar2 = (long *)*plVar2, plVar2 != (long *)0x0) {
    n = n + plVar2[2] + plVar2[6] + 8;
  }
  make_unsafe_uniq_array<char>((duckdb *)this,n);
  pp_Var1 = (this->schema_metadata_map)._M_h._M_buckets;
  *(undefined4 *)pp_Var1 = *(undefined4 *)(in_RSI + 0x18);
  while( true ) {
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) break;
    __n = plVar3[2];
    *(undefined4 *)((long)pp_Var1 + 4) = (int)__n;
    switchD_01939fa4::default(pp_Var1 + 1,(void *)plVar3[1],__n);
    __n_00 = plVar3[6];
    __dest = (void *)((long)pp_Var1 + __n + 0xc);
    *(int *)((long)__dest + -4) = (int)__n_00;
    switchD_01939fa4::default(__dest,(void *)plVar3[5],__n_00);
    pp_Var1 = (__buckets_ptr)((long)pp_Var1 + 4 + __n_00 + __n + 4);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

unsafe_unique_array<char> ArrowSchemaMetadata::SerializeMetadata() const {
	// First we have to figure out the total size:
	// 1. number of key-value pairs (int32)
	idx_t total_size = sizeof(int32_t);
	for (const auto &option : schema_metadata_map) {
		// 2. Length of the key and value (2 * int32)
		total_size += 2 * sizeof(int32_t);
		// 3. Length of key
		total_size += option.first.size();
		// 4. Length of value
		total_size += option.second.size();
	}
	auto metadata_array_ptr = make_unsafe_uniq_array<char>(total_size);
	auto metadata_ptr = metadata_array_ptr.get();
	// 1. number of key-value pairs (int32)
	const idx_t map_size = schema_metadata_map.size();
	memcpy(metadata_ptr, &map_size, sizeof(int32_t));
	metadata_ptr += sizeof(int32_t);
	// Iterate through each key-value pair in the map
	for (const auto &pair : schema_metadata_map) {
		const std::string &key = pair.first;
		idx_t key_size = key.size();
		// Length of the key (int32)
		memcpy(metadata_ptr, &key_size, sizeof(int32_t));
		metadata_ptr += sizeof(int32_t);
		// Key
		memcpy(metadata_ptr, key.c_str(), key_size);
		metadata_ptr += key_size;
		const std::string &value = pair.second;
		const idx_t value_size = value.size();
		// Length of the value (int32)
		memcpy(metadata_ptr, &value_size, sizeof(int32_t));
		metadata_ptr += sizeof(int32_t);
		// Value
		memcpy(metadata_ptr, value.c_str(), value_size);
		metadata_ptr += value_size;
	}
	return metadata_array_ptr;
}